

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O3

MemoryLeakDetectorNode * __thiscall
MemoryLeakDetectorList::getLeakFrom
          (MemoryLeakDetectorList *this,MemoryLeakDetectorNode *node,MemLeakPeriod period)

{
  MemoryLeakDetectorNode *cur;
  
  if (node != (MemoryLeakDetectorNode *)0x0 && period != mem_leak_period_all) {
    do {
      if (*(MemLeakPeriod *)(node + 0x30) == period) {
        return node;
      }
      if (period == mem_leak_period_enabled &&
          *(MemLeakPeriod *)(node + 0x30) != mem_leak_period_disabled) {
        return node;
      }
      node = *(MemoryLeakDetectorNode **)(node + 0x38);
    } while (node != (MemoryLeakDetectorNode *)0x0);
    node = (MemoryLeakDetectorNode *)0x0;
  }
  return node;
}

Assistant:

MemoryLeakDetectorNode* MemoryLeakDetectorList::getLeakFrom(MemoryLeakDetectorNode* node, MemLeakPeriod period)
{
    for (MemoryLeakDetectorNode* cur = node; cur; cur = cur->next_)
        if (isInPeriod(cur, period)) return cur;
    return NULLPTR;
}